

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O1

int Kit_PlaIsComplement(char *pSop)

{
  while( true ) {
    if (*pSop == '\n') {
      return (int)(pSop[-1] == 'n' || pSop[-1] == '0');
    }
    if (*pSop == '\0') break;
    pSop = pSop + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                ,0xa6,"int Kit_PlaIsComplement(char *)");
}

Assistant:

int Kit_PlaIsComplement( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur; pCur++ )
        if ( *pCur == '\n' )
            return (int)(*(pCur - 1) == '0' || *(pCur - 1) == 'n');
    assert( 0 );
    return 0;
}